

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddMousePosEvent(ImGuiIO *this,float x,float y)

{
  int *piVar1;
  int iVar2;
  ImGuiInputEvent *pIVar3;
  long lVar4;
  float *pfVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  int iVar8;
  ImGuiInputEvent *__dest;
  long lVar9;
  long lVar10;
  int iVar11;
  ImVec2 *pIVar12;
  ImGuiContext *g;
  
  pIVar6 = GImGui;
  if (this->AppAcceptingEvents != true) {
    return;
  }
  if (-3.4028235e+38 < x) {
    if (0.0 <= x) {
LAB_001e01da:
      iVar7 = (int)x;
    }
    else {
      if (((float)(int)x == x) && (!NAN((float)(int)x) && !NAN(x))) goto LAB_001e01da;
      iVar7 = (int)x + -1;
    }
    x = (float)iVar7;
  }
  if (y <= -3.4028235e+38) goto LAB_001e021e;
  if (0.0 <= y) {
LAB_001e0213:
    iVar7 = (int)y;
  }
  else {
    if (((float)(int)y == y) && (!NAN((float)(int)y) && !NAN(y))) goto LAB_001e0213;
    iVar7 = (int)y + -1;
  }
  y = (float)iVar7;
LAB_001e021e:
  iVar7 = (GImGui->InputEventsQueue).Size;
  lVar10 = (long)iVar7 + 1;
  lVar4 = (long)iVar7 * 0x18;
  do {
    if (lVar10 + -1 == 0 || lVar10 < 1) {
      lVar9 = 0;
      break;
    }
    pIVar3 = (GImGui->InputEventsQueue).Data;
    lVar9 = (long)&pIVar3[-1].Type + lVar4;
    piVar1 = (int *)((long)&pIVar3[-1].Type + lVar4);
    lVar10 = lVar10 + -1;
    lVar4 = lVar4 + -0x18;
  } while (*piVar1 != 1);
  pIVar12 = (ImVec2 *)(lVar9 + 8);
  pfVar5 = (float *)(lVar9 + 0xc);
  if (lVar9 == 0) {
    pIVar12 = &(GImGui->IO).MousePos;
    pfVar5 = &(GImGui->IO).MousePos.y;
  }
  if ((pIVar12->x == x) && (!NAN(pIVar12->x) && !NAN(x))) {
    if ((*pfVar5 == y) && (!NAN(*pfVar5) && !NAN(y))) {
      return;
    }
  }
  iVar2 = (GImGui->InputEventsQueue).Capacity;
  if (iVar7 == iVar2) {
    if (iVar2 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar2 / 2 + iVar2;
    }
    iVar11 = iVar7 + 1;
    if (iVar7 + 1 < iVar8) {
      iVar11 = iVar8;
    }
    if (iVar2 < iVar11) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)((long)iVar11 * 0x18,GImAllocatorUserData)
      ;
      pIVar3 = (pIVar6->InputEventsQueue).Data;
      if (pIVar3 != (ImGuiInputEvent *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar6->InputEventsQueue).Size * 0x18);
        pIVar3 = (pIVar6->InputEventsQueue).Data;
        if ((pIVar3 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (pIVar6->InputEventsQueue).Data = __dest;
      (pIVar6->InputEventsQueue).Capacity = iVar11;
    }
  }
  pIVar3 = (pIVar6->InputEventsQueue).Data;
  iVar7 = (pIVar6->InputEventsQueue).Size;
  pIVar3[iVar7].Type = ImGuiInputEventType_MousePos;
  pIVar3[iVar7].Source = ImGuiInputSource_Mouse;
  pIVar3[iVar7].field_2.MousePos.PosX = x;
  pIVar3[iVar7].field_2.MousePos.PosY = y;
  *(undefined8 *)((long)&pIVar3[iVar7].field_2 + 8) = 0;
  (pIVar6->InputEventsQueue).Size = (pIVar6->InputEventsQueue).Size + 1;
  return;
}

Assistant:

void ImGuiIO::AddMousePosEvent(float x, float y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (!AppAcceptingEvents)
        return;

    // Apply same flooring as UpdateMouseInputs()
    ImVec2 pos((x > -FLT_MAX) ? ImFloorSigned(x) : x, (y > -FLT_MAX) ? ImFloorSigned(y) : y);

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_MousePos);
    const ImVec2 latest_pos = latest_event ? ImVec2(latest_event->MousePos.PosX, latest_event->MousePos.PosY) : g.IO.MousePos;
    if (latest_pos.x == pos.x && latest_pos.y == pos.y)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MousePos;
    e.Source = ImGuiInputSource_Mouse;
    e.MousePos.PosX = pos.x;
    e.MousePos.PosY = pos.y;
    g.InputEventsQueue.push_back(e);
}